

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmMMU_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmPFlusha<(moira::Instr)180,(moira::Mode)8,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  u32 uVar2;
  
  uVar1 = *addr;
  uVar2 = dasmIncRead<2>(this,addr);
  if (((str->style->syntax & ~MOIRA_MIT) == GNU) && (((char)op != '\0' || ((uVar2 & 0x1ff) != 0))))
  {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)180,(moira::Mode)8,4>(this,str,addr,op);
    return;
  }
  StrWriter::operator<<(str);
  return;
}

Assistant:

void
Moira::dasmPFlusha(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead<Word>(addr);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtMMU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{};
}